

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

float ma_spatializer_get_min_gain(ma_spatializer *pSpatializer)

{
  if (pSpatializer != (ma_spatializer *)0x0) {
    return pSpatializer->minGain;
  }
  return 0.0;
}

Assistant:

MA_API float ma_spatializer_get_min_gain(const ma_spatializer* pSpatializer)
{
    if (pSpatializer == NULL) {
        return 0;
    }

    return ma_atomic_load_f32(&pSpatializer->minGain);
}